

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeForwardSubsumptionAndResolution.cpp
# Opt level: O2

bool __thiscall
Inferences::CodeTreeForwardSubsumptionAndResolution::perform
          (CodeTreeForwardSubsumptionAndResolution *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  Literal *pLVar1;
  ClauseIterator *this_00;
  int iVar2;
  Clause *unit;
  InferenceExtra *extra;
  uint i;
  ulong uVar3;
  bool bVar4;
  SingletonIterator<Kernel::Clause_*> it;
  SingletonIterator<Kernel::Clause_*> it_00;
  int resolvedQueryLit;
  ClauseIterator *local_a0;
  Stack<Kernel::Literal_*> local_98;
  SimplifyingInference2 local_78;
  Inference local_60;
  
  if ((this->_ct->super_CodeTree)._entryPoint == (CodeBlock *)0x0) {
    bVar4 = false;
  }
  else {
    if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::cm ==
         '\0') &&
       (iVar2 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                     ::cm), iVar2 != 0)) {
      perform::cm.lms._stack =
           (Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            *)0x0;
      perform::cm.lms._cursor =
           (Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            *)0x0;
      perform::cm.lInfos._array = (LitInfo *)0x0;
      perform::cm.lms._capacity = 0;
      perform::cm.lInfos._size = 0;
      perform::cm.lInfos._capacity = 0;
      perform::cm.lms._end =
           (Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            *)0x0;
      __cxa_atexit(Indexing::ClauseCodeTree::ClauseMatcher::~ClauseMatcher,&perform::cm,
                   &__dso_handle);
      __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                           ::cm);
    }
    Indexing::ClauseCodeTree::ClauseMatcher::init(&perform::cm,(EVP_PKEY_CTX *)this->_ct);
    local_78.premise2 =
         Indexing::ClauseCodeTree::ClauseMatcher::next(&perform::cm,&resolvedQueryLit);
    bVar4 = local_78.premise2 != (Clause *)0x0;
    if (bVar4) {
      if (resolvedQueryLit != -1) {
        local_98._cursor = (Literal **)0x0;
        local_98._end = (Literal **)0x0;
        local_98._capacity = 0;
        local_98._stack = (Literal **)0x0;
        local_a0 = premises;
        for (uVar3 = 0; uVar3 < ((uint)*(undefined8 *)&cl->field_0x38 & 0xfffff); uVar3 = uVar3 + 1)
        {
          if (uVar3 != (uint)resolvedQueryLit) {
            Lib::Stack<Kernel::Literal_*>::push(&local_98,cl->_literals[uVar3]);
          }
        }
        local_78.rule = SUBSUMPTION_RESOLUTION;
        local_78.premise1 = cl;
        Kernel::Inference::Inference(&local_60,&local_78);
        unit = Kernel::Clause::fromStack(&local_98,&local_60);
        this_00 = local_a0;
        *replacement = unit;
        if (*(int *)(Lib::env + 0x85a8) == 2) {
          extra = (InferenceExtra *)::operator_new(0x10);
          pLVar1 = cl->_literals[resolvedQueryLit];
          extra->_vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_009fc5e8;
          extra[1]._vptr_InferenceExtra = (_func_int **)pLVar1;
          Lib::ProofExtra::insert((ProofExtra *)&DAT_00a141b8,&unit->super_Unit,extra);
        }
        it._el = (Clause *)0x0;
        it._0_8_ = &local_78;
        Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it);
        Lib::VirtualIterator<Kernel::Clause_*>::operator=
                  (this_00,(VirtualIterator<Kernel::Clause_*> *)&local_78);
        Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                  ((VirtualIterator<Kernel::Clause_*> *)&local_78);
        *(int *)(DAT_00a141a0 + 0x140) = *(int *)(DAT_00a141a0 + 0x140) + 1;
        Indexing::ClauseCodeTree::ClauseMatcher::reset(&perform::cm);
        Lib::Stack<Kernel::Literal_*>::~Stack(&local_98);
        return bVar4;
      }
      it_00._el = (Clause *)0x0;
      it_00._0_8_ = &local_98;
      Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it_00);
      Lib::VirtualIterator<Kernel::Clause_*>::operator=
                (premises,(VirtualIterator<Kernel::Clause_*> *)&local_98);
      Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                ((VirtualIterator<Kernel::Clause_*> *)&local_98);
      *(int *)(DAT_00a141a0 + 0x1b4) = *(int *)(DAT_00a141a0 + 0x1b4) + 1;
    }
    Indexing::ClauseCodeTree::ClauseMatcher::reset(&perform::cm);
  }
  return bVar4;
}

Assistant:

bool CodeTreeForwardSubsumptionAndResolution::perform(Clause *cl, Clause *&replacement, ClauseIterator &premises)
{
  if (_ct->isEmpty()) {
    return false;
  }

  static ClauseCodeTree::ClauseMatcher cm;

  cm.init(_ct, cl, _subsumptionResolution);

  Clause* premise;
  int resolvedQueryLit;

  while ((premise = cm.next(resolvedQueryLit))) {
    if (resolvedQueryLit == -1) {
      ASS(satSubs.checkSubsumption(premise, cl));
      premises = pvi(getSingletonIterator(premise));
      env.statistics->forwardSubsumed++;
      cm.reset();
      return true;
    }
    ASS(satSubs.checkSubsumptionResolutionWithLiteral(premise, cl, resolvedQueryLit));

    LiteralStack res;
    for (unsigned i = 0; i < cl->length(); i++) {
      if (i == (unsigned)resolvedQueryLit) {
        continue;
      }
      res.push((*cl)[i]);
    }
    replacement = Clause::fromStack(res, SimplifyingInference2(InferenceRule::SUBSUMPTION_RESOLUTION, cl, premise));
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new LiteralInferenceExtra((*cl)[resolvedQueryLit]));
    premises = pvi(getSingletonIterator(premise));
    env.statistics->forwardSubsumptionResolution++;
    cm.reset();
    return true;
  }

  cm.reset();
  return false;
}